

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall leveldb::DBImpl::RecordBackgroundError(DBImpl *this,Status *s)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->bg_error_).state_ == (char *)0x0) {
    if (s->state_ != (char *)0x0) {
      pcVar2 = Status::CopyState(s->state_);
      (this->bg_error_).state_ = pcVar2;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::condition_variable::notify_all();
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::RecordBackgroundError(const Status& s) {
  mutex_.AssertHeld();
  if (bg_error_.ok()) {
    bg_error_ = s;
    background_work_finished_signal_.SignalAll();
  }
}